

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

int lua_pcallk(lua_State *L,int nargs,int nresults,int errfunc,int ctx,lua_CFunction k)

{
  CallInfo *pCVar1;
  TValue *pTVar2;
  CallInfo *ci;
  StkId o;
  ptrdiff_t func;
  StkId pTStack_38;
  int status;
  CallS c;
  lua_CFunction k_local;
  int ctx_local;
  int errfunc_local;
  int nresults_local;
  int nargs_local;
  lua_State *L_local;
  
  c._8_8_ = k;
  if (errfunc == 0) {
    o = (StkId)0x0;
  }
  else {
    pTVar2 = index2addr(L,errfunc);
    o = (StkId)((long)pTVar2 - (long)L->stack);
  }
  pTStack_38 = L->top + -(long)(nargs + 1);
  if ((c._8_8_ == 0) || (L->nny != 0)) {
    c.func._0_4_ = nresults;
    func._4_4_ = luaD_pcall(L,f_call,&stack0xffffffffffffffc8,(long)pTStack_38 - (long)L->stack,
                            (ptrdiff_t)o);
  }
  else {
    pCVar1 = L->ci;
    (pCVar1->u).l.savedpc = (Instruction *)c._8_8_;
    (pCVar1->u).c.ctx = ctx;
    pCVar1->extra = (long)pTStack_38 - (long)L->stack;
    (pCVar1->u).c.old_allowhook = L->allowhook;
    (pCVar1->u).c.old_errfunc = L->errfunc;
    L->errfunc = (ptrdiff_t)o;
    pCVar1->callstatus = pCVar1->callstatus | 0x10;
    luaD_call(L,pTStack_38,nresults,1);
    pCVar1->callstatus = pCVar1->callstatus & 0xef;
    L->errfunc = (pCVar1->u).c.old_errfunc;
    func._4_4_ = 0;
  }
  if ((nresults == -1) && (L->ci->top < L->top)) {
    L->ci->top = L->top;
  }
  return func._4_4_;
}

Assistant:

LUA_API int lua_pcallk (lua_State *L, int nargs, int nresults, int errfunc,
                        int ctx, lua_CFunction k) {
  struct CallS c;
  int status;
  ptrdiff_t func;
  lua_lock(L);
  api_check(L, k == NULL || !isLua(L->ci),
    "cannot use continuations inside hooks");
  api_checknelems(L, nargs+1);
  api_check(L, L->status == LUA_OK, "cannot do calls on non-normal thread");
  checkresults(L, nargs, nresults);
  if (errfunc == 0)
    func = 0;
  else {
    StkId o = index2addr(L, errfunc);
    api_checkstackindex(L, errfunc, o);
    func = savestack(L, o);
  }
  c.func = L->top - (nargs+1);  /* function to be called */
  if (k == NULL || L->nny > 0) {  /* no continuation or no yieldable? */
    c.nresults = nresults;  /* do a 'conventional' protected call */
    status = luaD_pcall(L, f_call, &c, savestack(L, c.func), func);
  }
  else {  /* prepare continuation (call is already protected by 'resume') */
    CallInfo *ci = L->ci;
    ci->u.c.k = k;  /* save continuation */
    ci->u.c.ctx = ctx;  /* save context */
    /* save information for error recovery */
    ci->extra = savestack(L, c.func);
    ci->u.c.old_allowhook = L->allowhook;
    ci->u.c.old_errfunc = L->errfunc;
    L->errfunc = func;
    /* mark that function may do error recovery */
    ci->callstatus |= CIST_YPCALL;
    luaD_call(L, c.func, nresults, 1);  /* do the call */
    ci->callstatus &= ~CIST_YPCALL;
    L->errfunc = ci->u.c.old_errfunc;
    status = LUA_OK;  /* if it is here, there were no errors */
  }
  adjustresults(L, nresults);
  lua_unlock(L);
  return status;
}